

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O0

double incircleexact(double *pa,double *pb,double *pc,double *pd)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double _0;
  double _j;
  double _i;
  double err3;
  double err2;
  double err1;
  double blo;
  double bhi;
  double alo;
  double ahi;
  double abig;
  double c;
  double around;
  double bround;
  double avirt;
  double bvirt;
  int i;
  int deterlen;
  double deter [384];
  int cdlen;
  int ablen;
  double cddet [192];
  double abdet [192];
  int dlen;
  int clen;
  int blen;
  int alen;
  double ddet [96];
  double cdet [96];
  double bdet [96];
  double adet [96];
  int ylen;
  int xlen;
  double det48y [48];
  double det48x [48];
  double det24y [24];
  double det24x [24];
  int dablen;
  int cdalen;
  int bcdlen;
  int abclen;
  double dab [12];
  double cda [12];
  double bcd [12];
  double abc [12];
  int templen;
  double temp8 [8];
  double bd [4];
  double ac [4];
  double da [4];
  double cd [4];
  double bc [4];
  double ab [4];
  double dxby0;
  double cxay0;
  double axdy0;
  double dxcy0;
  double cxby0;
  double bxay0;
  double bxdy0;
  double axcy0;
  double dxay0;
  double cxdy0;
  double bxcy0;
  double axby0;
  double dxby1;
  double cxay1;
  double axdy1;
  double dxcy1;
  double cxby1;
  double bxay1;
  double bxdy1;
  double axcy1;
  double dxay1;
  double cxdy1;
  double bxcy1;
  double axby1;
  double *pd_local;
  double *pc_local;
  double *pb_local;
  double *pa_local;
  
  dVar6 = splitter * *pa - (splitter * *pa - *pa);
  dVar7 = splitter * pb[1] - (splitter * pb[1] - pb[1]);
  dVar6 = (*pa - dVar6) * (pb[1] - dVar7) +
          -(-dVar6 * (pb[1] - dVar7) + -(*pa - dVar6) * dVar7 + -dVar6 * dVar7 + *pa * pb[1]);
  dVar7 = splitter * *pb - (splitter * *pb - *pb);
  dVar8 = splitter * pa[1] - (splitter * pa[1] - pa[1]);
  dVar7 = (*pb - dVar7) * (pa[1] - dVar8) +
          -(-dVar7 * (pa[1] - dVar8) + -(*pb - dVar7) * dVar8 + -dVar7 * dVar8 + *pb * pa[1]);
  dVar8 = dVar6 - dVar7;
  dVar9 = dVar6 - dVar8;
  bc[3] = (dVar6 - (dVar8 + dVar9)) + (dVar9 - dVar7);
  dVar6 = *pb * pc[1];
  dVar7 = splitter * *pb - (splitter * *pb - *pb);
  dVar8 = splitter * pc[1] - (splitter * pc[1] - pc[1]);
  dVar7 = (*pb - dVar7) * (pc[1] - dVar8) +
          -(-dVar7 * (pc[1] - dVar8) + -(*pb - dVar7) * dVar8 + -dVar7 * dVar8 + dVar6);
  dVar8 = *pc * pb[1];
  dVar9 = splitter * *pc - (splitter * *pc - *pc);
  dVar10 = splitter * pb[1] - (splitter * pb[1] - pb[1]);
  dVar9 = (*pc - dVar9) * (pb[1] - dVar10) +
          -(-dVar9 * (pb[1] - dVar10) + -(*pc - dVar9) * dVar10 + -dVar9 * dVar10 + dVar8);
  dVar10 = dVar7 - dVar9;
  cd[3] = (dVar7 - (dVar10 + (dVar7 - dVar10))) + ((dVar7 - dVar10) - dVar9);
  dVar7 = dVar6 + dVar10;
  dVar6 = (dVar6 - (dVar7 - (dVar7 - dVar6))) + (dVar10 - (dVar7 - dVar6));
  dVar9 = dVar6 - dVar8;
  bc[0] = (dVar6 - (dVar9 + (dVar6 - dVar9))) + ((dVar6 - dVar9) - dVar8);
  bc[2] = dVar7 + dVar9;
  bc[1] = (dVar7 - (bc[2] - (bc[2] - dVar7))) + (dVar9 - (bc[2] - dVar7));
  dVar6 = *pc * pd[1];
  dVar7 = splitter * *pc - (splitter * *pc - *pc);
  dVar8 = splitter * pd[1] - (splitter * pd[1] - pd[1]);
  dVar7 = (*pc - dVar7) * (pd[1] - dVar8) +
          -(-dVar7 * (pd[1] - dVar8) + -(*pc - dVar7) * dVar8 + -dVar7 * dVar8 + dVar6);
  dVar8 = *pd * pc[1];
  dVar9 = splitter * *pd - (splitter * *pd - *pd);
  dVar10 = splitter * pc[1] - (splitter * pc[1] - pc[1]);
  dVar9 = (*pd - dVar9) * (pc[1] - dVar10) +
          -(-dVar9 * (pc[1] - dVar10) + -(*pd - dVar9) * dVar10 + -dVar9 * dVar10 + dVar8);
  dVar10 = dVar7 - dVar9;
  da[3] = (dVar7 - (dVar10 + (dVar7 - dVar10))) + ((dVar7 - dVar10) - dVar9);
  dVar7 = dVar6 + dVar10;
  dVar6 = (dVar6 - (dVar7 - (dVar7 - dVar6))) + (dVar10 - (dVar7 - dVar6));
  dVar9 = dVar6 - dVar8;
  cd[0] = (dVar6 - (dVar9 + (dVar6 - dVar9))) + ((dVar6 - dVar9) - dVar8);
  cd[2] = dVar7 + dVar9;
  cd[1] = (dVar7 - (cd[2] - (cd[2] - dVar7))) + (dVar9 - (cd[2] - dVar7));
  dVar6 = *pd * pa[1];
  dVar7 = splitter * *pd - (splitter * *pd - *pd);
  dVar8 = splitter * pa[1] - (splitter * pa[1] - pa[1]);
  dVar7 = (*pd - dVar7) * (pa[1] - dVar8) +
          -(-dVar7 * (pa[1] - dVar8) + -(*pd - dVar7) * dVar8 + -dVar7 * dVar8 + dVar6);
  dVar8 = *pa * pd[1];
  dVar9 = splitter * *pa - (splitter * *pa - *pa);
  dVar10 = splitter * pd[1] - (splitter * pd[1] - pd[1]);
  dVar9 = (*pa - dVar9) * (pd[1] - dVar10) +
          -(-dVar9 * (pd[1] - dVar10) + -(*pa - dVar9) * dVar10 + -dVar9 * dVar10 + dVar8);
  dVar10 = dVar7 - dVar9;
  ac[3] = (dVar7 - (dVar10 + (dVar7 - dVar10))) + ((dVar7 - dVar10) - dVar9);
  dVar7 = dVar6 + dVar10;
  dVar6 = (dVar6 - (dVar7 - (dVar7 - dVar6))) + (dVar10 - (dVar7 - dVar6));
  dVar9 = dVar6 - dVar8;
  da[0] = (dVar6 - (dVar9 + (dVar6 - dVar9))) + ((dVar6 - dVar9) - dVar8);
  da[2] = dVar7 + dVar9;
  da[1] = (dVar7 - (da[2] - (da[2] - dVar7))) + (dVar9 - (da[2] - dVar7));
  dVar6 = *pa * pc[1];
  dVar7 = splitter * *pa - (splitter * *pa - *pa);
  dVar8 = splitter * pc[1] - (splitter * pc[1] - pc[1]);
  dVar7 = (*pa - dVar7) * (pc[1] - dVar8) +
          -(-dVar7 * (pc[1] - dVar8) + -(*pa - dVar7) * dVar8 + -dVar7 * dVar8 + dVar6);
  dVar8 = *pc * pa[1];
  dVar9 = splitter * *pc - (splitter * *pc - *pc);
  dVar10 = splitter * pa[1] - (splitter * pa[1] - pa[1]);
  dVar9 = (*pc - dVar9) * (pa[1] - dVar10) +
          -(-dVar9 * (pa[1] - dVar10) + -(*pc - dVar9) * dVar10 + -dVar9 * dVar10 + dVar8);
  dVar10 = dVar7 - dVar9;
  bd[3] = (dVar7 - (dVar10 + (dVar7 - dVar10))) + ((dVar7 - dVar10) - dVar9);
  dVar7 = dVar6 + dVar10;
  dVar6 = (dVar6 - (dVar7 - (dVar7 - dVar6))) + (dVar10 - (dVar7 - dVar6));
  dVar9 = dVar6 - dVar8;
  ac[0] = (dVar6 - (dVar9 + (dVar6 - dVar9))) + ((dVar6 - dVar9) - dVar8);
  ac[2] = dVar7 + dVar9;
  ac[1] = (dVar7 - (ac[2] - (ac[2] - dVar7))) + (dVar9 - (ac[2] - dVar7));
  dVar6 = *pb * pd[1];
  dVar7 = splitter * *pb - (splitter * *pb - *pb);
  dVar8 = splitter * pd[1] - (splitter * pd[1] - pd[1]);
  dVar7 = (*pb - dVar7) * (pd[1] - dVar8) +
          -(-dVar7 * (pd[1] - dVar8) + -(*pb - dVar7) * dVar8 + -dVar7 * dVar8 + dVar6);
  dVar8 = *pd * pb[1];
  dVar9 = splitter * *pd - (splitter * *pd - *pd);
  dVar10 = splitter * pb[1] - (splitter * pb[1] - pb[1]);
  dVar9 = (*pd - dVar9) * (pb[1] - dVar10) +
          -(-dVar9 * (pb[1] - dVar10) + -(*pd - dVar9) * dVar10 + -dVar9 * dVar10 + dVar8);
  dVar10 = dVar7 - dVar9;
  temp8[7] = (dVar7 - (dVar10 + (dVar7 - dVar10))) + ((dVar7 - dVar10) - dVar9);
  dVar7 = dVar6 + dVar10;
  dVar6 = (dVar6 - (dVar7 - (dVar7 - dVar6))) + (dVar10 - (dVar7 - dVar6));
  dVar9 = dVar6 - dVar8;
  bd[0] = (dVar6 - (dVar9 + (dVar6 - dVar9))) + ((dVar6 - dVar9) - dVar8);
  bd[2] = dVar7 + dVar9;
  bd[1] = (dVar7 - (bd[2] - (bd[2] - dVar7))) + (dVar9 - (bd[2] - dVar7));
  iVar1 = fast_expansion_sum_zeroelim(4,da + 3,4,ac + 3,(double *)&stack0xfffffffffffffe18);
  iVar1 = fast_expansion_sum_zeroelim(iVar1,(double *)&stack0xfffffffffffffe18,4,bd + 3,dab + 0xb);
  iVar2 = fast_expansion_sum_zeroelim(4,ac + 3,4,bc + 3,(double *)&stack0xfffffffffffffe18);
  iVar2 = fast_expansion_sum_zeroelim
                    (iVar2,(double *)&stack0xfffffffffffffe18,4,temp8 + 7,(double *)&bcdlen);
  for (bvirt._0_4_ = 0; bvirt._0_4_ < 4; bvirt._0_4_ = bvirt._0_4_ + 1) {
    temp8[(long)bvirt._0_4_ + 7] = -temp8[(long)bvirt._0_4_ + 7];
    bd[(long)bvirt._0_4_ + 3] = -bd[(long)bvirt._0_4_ + 3];
  }
  iVar3 = fast_expansion_sum_zeroelim(4,bc + 3,4,cd + 3,(double *)&stack0xfffffffffffffe18);
  iVar3 = fast_expansion_sum_zeroelim(iVar3,(double *)&stack0xfffffffffffffe18,4,bd + 3,bcd + 0xb);
  iVar4 = fast_expansion_sum_zeroelim(4,cd + 3,4,da + 3,(double *)&stack0xfffffffffffffe18);
  iVar4 = fast_expansion_sum_zeroelim
                    (iVar4,(double *)&stack0xfffffffffffffe18,4,temp8 + 7,cda + 0xb);
  iVar5 = scale_expansion_zeroelim(iVar4,cda + 0xb,*pa,det24y + 0x17);
  iVar5 = scale_expansion_zeroelim(iVar5,det24y + 0x17,*pa,det48y + 0x2f);
  iVar4 = scale_expansion_zeroelim(iVar4,cda + 0xb,pa[1],det48x + 0x2f);
  iVar4 = scale_expansion_zeroelim(iVar4,det48x + 0x2f,pa[1],(double *)&ylen);
  iVar4 = fast_expansion_sum_zeroelim(iVar5,det48y + 0x2f,iVar4,(double *)&ylen,bdet + 0x5f);
  iVar5 = scale_expansion_zeroelim(iVar1,dab + 0xb,*pb,det24y + 0x17);
  iVar5 = scale_expansion_zeroelim(iVar5,det24y + 0x17,-*pb,det48y + 0x2f);
  iVar1 = scale_expansion_zeroelim(iVar1,dab + 0xb,pb[1],det48x + 0x2f);
  iVar1 = scale_expansion_zeroelim(iVar1,det48x + 0x2f,-pb[1],(double *)&ylen);
  iVar1 = fast_expansion_sum_zeroelim(iVar5,det48y + 0x2f,iVar1,(double *)&ylen,cdet + 0x5f);
  iVar5 = scale_expansion_zeroelim(iVar2,(double *)&bcdlen,*pc,det24y + 0x17);
  iVar5 = scale_expansion_zeroelim(iVar5,det24y + 0x17,*pc,det48y + 0x2f);
  iVar2 = scale_expansion_zeroelim(iVar2,(double *)&bcdlen,pc[1],det48x + 0x2f);
  iVar2 = scale_expansion_zeroelim(iVar2,det48x + 0x2f,pc[1],(double *)&ylen);
  iVar2 = fast_expansion_sum_zeroelim(iVar5,det48y + 0x2f,iVar2,(double *)&ylen,ddet + 0x5f);
  iVar5 = scale_expansion_zeroelim(iVar3,bcd + 0xb,*pd,det24y + 0x17);
  iVar5 = scale_expansion_zeroelim(iVar5,det24y + 0x17,-*pd,det48y + 0x2f);
  iVar3 = scale_expansion_zeroelim(iVar3,bcd + 0xb,pd[1],det48x + 0x2f);
  iVar3 = scale_expansion_zeroelim(iVar3,det48x + 0x2f,-pd[1],(double *)&ylen);
  iVar3 = fast_expansion_sum_zeroelim(iVar5,det48y + 0x2f,iVar3,(double *)&ylen,(double *)&blen);
  iVar1 = fast_expansion_sum_zeroelim(iVar4,bdet + 0x5f,iVar1,cdet + 0x5f,cddet + 0xbf);
  iVar2 = fast_expansion_sum_zeroelim(iVar2,ddet + 0x5f,iVar3,(double *)&blen,(double *)&cdlen);
  iVar1 = fast_expansion_sum_zeroelim(iVar1,cddet + 0xbf,iVar2,(double *)&cdlen,(double *)&i);
  return *(double *)(&i + (long)(iVar1 + -1) * 2);
}

Assistant:

REAL incircleexact(REAL *pa, REAL *pb, REAL *pc, REAL *pd)
{
  INEXACT REAL axby1, bxcy1, cxdy1, dxay1, axcy1, bxdy1;
  INEXACT REAL bxay1, cxby1, dxcy1, axdy1, cxay1, dxby1;
  REAL axby0, bxcy0, cxdy0, dxay0, axcy0, bxdy0;
  REAL bxay0, cxby0, dxcy0, axdy0, cxay0, dxby0;
  REAL ab[4], bc[4], cd[4], da[4], ac[4], bd[4];
  REAL temp8[8];
  int templen;
  REAL abc[12], bcd[12], cda[12], dab[12];
  int abclen, bcdlen, cdalen, dablen;
  REAL det24x[24], det24y[24], det48x[48], det48y[48];
  int xlen, ylen;
  REAL adet[96], bdet[96], cdet[96], ddet[96];
  int alen, blen, clen, dlen;
  REAL abdet[192], cddet[192];
  int ablen, cdlen;
  REAL deter[384];
  int deterlen;
  int i;

  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  INEXACT REAL c;
  INEXACT REAL abig;
  REAL ahi, alo, bhi, blo;
  REAL err1, err2, err3;
  INEXACT REAL _i, _j;
  REAL _0;

  Two_Product(pa[0], pb[1], axby1, axby0);
  Two_Product(pb[0], pa[1], bxay1, bxay0);
  Two_Two_Diff(axby1, axby0, bxay1, bxay0, ab[3], ab[2], ab[1], ab[0]);

  Two_Product(pb[0], pc[1], bxcy1, bxcy0);
  Two_Product(pc[0], pb[1], cxby1, cxby0);
  Two_Two_Diff(bxcy1, bxcy0, cxby1, cxby0, bc[3], bc[2], bc[1], bc[0]);

  Two_Product(pc[0], pd[1], cxdy1, cxdy0);
  Two_Product(pd[0], pc[1], dxcy1, dxcy0);
  Two_Two_Diff(cxdy1, cxdy0, dxcy1, dxcy0, cd[3], cd[2], cd[1], cd[0]);

  Two_Product(pd[0], pa[1], dxay1, dxay0);
  Two_Product(pa[0], pd[1], axdy1, axdy0);
  Two_Two_Diff(dxay1, dxay0, axdy1, axdy0, da[3], da[2], da[1], da[0]);

  Two_Product(pa[0], pc[1], axcy1, axcy0);
  Two_Product(pc[0], pa[1], cxay1, cxay0);
  Two_Two_Diff(axcy1, axcy0, cxay1, cxay0, ac[3], ac[2], ac[1], ac[0]);

  Two_Product(pb[0], pd[1], bxdy1, bxdy0);
  Two_Product(pd[0], pb[1], dxby1, dxby0);
  Two_Two_Diff(bxdy1, bxdy0, dxby1, dxby0, bd[3], bd[2], bd[1], bd[0]);

  templen = fast_expansion_sum_zeroelim(4, cd, 4, da, temp8);
  cdalen = fast_expansion_sum_zeroelim(templen, temp8, 4, ac, cda);
  templen = fast_expansion_sum_zeroelim(4, da, 4, ab, temp8);
  dablen = fast_expansion_sum_zeroelim(templen, temp8, 4, bd, dab);
  for (i = 0; i < 4; i++) {
    bd[i] = -bd[i];
    ac[i] = -ac[i];
  }
  templen = fast_expansion_sum_zeroelim(4, ab, 4, bc, temp8);
  abclen = fast_expansion_sum_zeroelim(templen, temp8, 4, ac, abc);
  templen = fast_expansion_sum_zeroelim(4, bc, 4, cd, temp8);
  bcdlen = fast_expansion_sum_zeroelim(templen, temp8, 4, bd, bcd);

  xlen = scale_expansion_zeroelim(bcdlen, bcd, pa[0], det24x);
  xlen = scale_expansion_zeroelim(xlen, det24x, pa[0], det48x);
  ylen = scale_expansion_zeroelim(bcdlen, bcd, pa[1], det24y);
  ylen = scale_expansion_zeroelim(ylen, det24y, pa[1], det48y);
  alen = fast_expansion_sum_zeroelim(xlen, det48x, ylen, det48y, adet);

  xlen = scale_expansion_zeroelim(cdalen, cda, pb[0], det24x);
  xlen = scale_expansion_zeroelim(xlen, det24x, -pb[0], det48x);
  ylen = scale_expansion_zeroelim(cdalen, cda, pb[1], det24y);
  ylen = scale_expansion_zeroelim(ylen, det24y, -pb[1], det48y);
  blen = fast_expansion_sum_zeroelim(xlen, det48x, ylen, det48y, bdet);

  xlen = scale_expansion_zeroelim(dablen, dab, pc[0], det24x);
  xlen = scale_expansion_zeroelim(xlen, det24x, pc[0], det48x);
  ylen = scale_expansion_zeroelim(dablen, dab, pc[1], det24y);
  ylen = scale_expansion_zeroelim(ylen, det24y, pc[1], det48y);
  clen = fast_expansion_sum_zeroelim(xlen, det48x, ylen, det48y, cdet);

  xlen = scale_expansion_zeroelim(abclen, abc, pd[0], det24x);
  xlen = scale_expansion_zeroelim(xlen, det24x, -pd[0], det48x);
  ylen = scale_expansion_zeroelim(abclen, abc, pd[1], det24y);
  ylen = scale_expansion_zeroelim(ylen, det24y, -pd[1], det48y);
  dlen = fast_expansion_sum_zeroelim(xlen, det48x, ylen, det48y, ddet);

  ablen = fast_expansion_sum_zeroelim(alen, adet, blen, bdet, abdet);
  cdlen = fast_expansion_sum_zeroelim(clen, cdet, dlen, ddet, cddet);
  deterlen = fast_expansion_sum_zeroelim(ablen, abdet, cdlen, cddet, deter);

  return deter[deterlen - 1];
}